

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O1

int read_markers(j_decompress_ptr cinfo)

{
  byte bVar1;
  byte bVar2;
  JOCTET JVar3;
  JOCTET JVar4;
  jpeg_source_mgr *pjVar5;
  boolean bVar6;
  int iVar7;
  uint uVar8;
  JHUFF_TBL *pJVar9;
  JQUANT_TBL *pJVar10;
  boolean is_arith;
  jpeg_error_mgr *pjVar11;
  uint uVar12;
  JHUFF_TBL **ppJVar13;
  ulong uVar14;
  ulong uVar15;
  boolean is_baseline;
  UINT16 UVar16;
  byte *pbVar17;
  JOCTET *pJVar18;
  long lVar19;
  byte *pbVar20;
  jpeg_component_info *pjVar21;
  size_t sVar22;
  long lVar23;
  bool bVar24;
  UINT8 bits [17];
  int *local_1a8;
  byte local_198 [24];
  ulong local_180;
  jpeg_source_mgr *local_178;
  JHUFF_TBL **local_170;
  JHUFF_TBL **local_168;
  ulong local_160;
  ulong local_158;
  UINT8 *local_150;
  UINT8 *local_148;
  UINT8 *local_140;
  byte local_138 [264];
  
  local_168 = cinfo->ac_huff_tbl_ptrs;
  local_170 = cinfo->dc_huff_tbl_ptrs;
  local_140 = cinfo->arith_dc_L;
  local_148 = cinfo->arith_dc_U;
  local_150 = cinfo->arith_ac_K;
  do {
    if (cinfo->unread_marker == 0) {
      if (cinfo->marker->saw_SOI == 0) {
        pjVar5 = cinfo->src;
        sVar22 = pjVar5->bytes_in_buffer;
        if (sVar22 == 0) {
          bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
          if (bVar6 == 0) goto LAB_001067e7;
          sVar22 = pjVar5->bytes_in_buffer;
        }
        bVar1 = *pjVar5->next_input_byte;
        sVar22 = sVar22 - 1;
        if (sVar22 == 0) {
          bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
          if (bVar6 == 0) goto LAB_001067e7;
          pbVar17 = pjVar5->next_input_byte;
          sVar22 = pjVar5->bytes_in_buffer;
        }
        else {
          pbVar17 = pjVar5->next_input_byte + 1;
        }
        bVar2 = *pbVar17;
        if (bVar2 != 0xd8 || bVar1 != 0xff) {
          pjVar11 = cinfo->err;
          pjVar11->msg_code = 0x37;
          *(uint *)&pjVar11->msg_parm = (uint)bVar1;
          *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)bVar2;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        cinfo->unread_marker = (uint)bVar2;
        pjVar5->next_input_byte = pbVar17 + 1;
        pjVar5->bytes_in_buffer = sVar22 - 1;
      }
      else {
        bVar6 = next_marker(cinfo);
        if (bVar6 == 0) goto LAB_001067e7;
      }
    }
    iVar7 = cinfo->unread_marker;
    switch(iVar7) {
    case 0xc0:
      is_baseline = 1;
      goto LAB_00105b03;
    case 0xc1:
      is_baseline = 0;
LAB_00105b03:
      bVar6 = 0;
LAB_00105b05:
      is_arith = 0;
LAB_00105c1a:
      bVar6 = get_sof(cinfo,is_baseline,bVar6,is_arith);
      if (bVar6 == 0) {
        return 0;
      }
      break;
    case 0xc2:
      is_baseline = 0;
      bVar6 = 1;
      goto LAB_00105b05;
    case 0xc3:
    case 0xc5:
    case 0xc6:
    case 199:
    case 200:
    case 0xcb:
    case 0xcd:
    case 0xce:
    case 0xcf:
      pjVar11 = cinfo->err;
      pjVar11->msg_code = 0x3e;
      goto LAB_00105a30;
    case 0xc4:
      pjVar5 = cinfo->src;
      sVar22 = pjVar5->bytes_in_buffer;
      if (sVar22 == 0) {
        bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
        if (bVar6 == 0) goto LAB_001067e7;
        sVar22 = pjVar5->bytes_in_buffer;
      }
      bVar1 = *pjVar5->next_input_byte;
      sVar22 = sVar22 - 1;
      if (sVar22 == 0) {
        bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
        if (bVar6 == 0) goto LAB_001067e7;
        pbVar17 = pjVar5->next_input_byte;
        sVar22 = pjVar5->bytes_in_buffer;
      }
      else {
        pbVar17 = pjVar5->next_input_byte + 1;
      }
      uVar14 = (ulong)bVar1 * 0x100;
      sVar22 = sVar22 - 1;
      pbVar20 = pbVar17 + 1;
      lVar19 = uVar14 + *pbVar17 + -2;
      if (0x12 < (uVar14 | *pbVar17)) {
        do {
          if (sVar22 == 0) {
            bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
            if (bVar6 == 0) goto LAB_001067e7;
            pbVar20 = pjVar5->next_input_byte;
            sVar22 = pjVar5->bytes_in_buffer;
          }
          bVar1 = *pbVar20;
          pjVar11 = cinfo->err;
          pjVar11->msg_code = 0x52;
          *(uint *)&pjVar11->msg_parm = (uint)bVar1;
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
          local_198[0] = 0;
          pbVar20 = pbVar20 + 1;
          sVar22 = sVar22 - 1;
          uVar12 = 0;
          lVar23 = 1;
          do {
            if (sVar22 == 0) {
              bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
              if (bVar6 == 0) goto LAB_001067e7;
              pbVar20 = pjVar5->next_input_byte;
              sVar22 = pjVar5->bytes_in_buffer;
            }
            bVar2 = *pbVar20;
            local_198[lVar23] = bVar2;
            uVar12 = uVar12 + bVar2;
            lVar23 = lVar23 + 1;
            pbVar20 = pbVar20 + 1;
            sVar22 = sVar22 - 1;
          } while (lVar23 != 0x11);
          pjVar11 = cinfo->err;
          *(uint *)&pjVar11->msg_parm = (uint)local_198[1];
          *(uint *)((long)&pjVar11->msg_parm + 4) = (uint)local_198[2];
          *(uint *)((long)&pjVar11->msg_parm + 8) = (uint)local_198[3];
          *(uint *)((long)&pjVar11->msg_parm + 0xc) = (uint)local_198[4];
          *(uint *)((long)&pjVar11->msg_parm + 0x10) = (uint)local_198[5];
          *(uint *)((long)&pjVar11->msg_parm + 0x14) = (uint)local_198[6];
          *(uint *)((long)&pjVar11->msg_parm + 0x18) = (uint)local_198[7];
          *(uint *)((long)&pjVar11->msg_parm + 0x1c) = (uint)local_198[8];
          pjVar11->msg_code = 0x58;
          (*pjVar11->emit_message)((j_common_ptr)cinfo,2);
          pjVar11 = cinfo->err;
          *(uint *)&pjVar11->msg_parm = (uint)local_198[9];
          *(uint *)((long)&pjVar11->msg_parm + 4) = (uint)local_198[10];
          *(uint *)((long)&pjVar11->msg_parm + 8) = (uint)local_198[0xb];
          *(uint *)((long)&pjVar11->msg_parm + 0xc) = (uint)local_198[0xc];
          *(uint *)((long)&pjVar11->msg_parm + 0x10) = (uint)local_198[0xd];
          *(uint *)((long)&pjVar11->msg_parm + 0x14) = (uint)local_198[0xe];
          *(uint *)((long)&pjVar11->msg_parm + 0x18) = (uint)local_198[0xf];
          *(uint *)((long)&pjVar11->msg_parm + 0x1c) = (uint)local_198[0x10];
          pjVar11->msg_code = 0x58;
          (*pjVar11->emit_message)((j_common_ptr)cinfo,2);
          uVar14 = (ulong)uVar12;
          if ((0x100 < uVar12) || (lVar19 + -0x11 < (long)uVar14)) {
            pjVar11 = cinfo->err;
            pjVar11->msg_code = 9;
            (*pjVar11->error_exit)((j_common_ptr)cinfo);
          }
          if (uVar12 != 0) {
            uVar15 = 0;
            do {
              if (sVar22 == 0) {
                bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
                if (bVar6 == 0) goto LAB_001067e7;
                pbVar20 = pjVar5->next_input_byte;
                sVar22 = pjVar5->bytes_in_buffer;
              }
              sVar22 = sVar22 - 1;
              bVar2 = *pbVar20;
              pbVar20 = pbVar20 + 1;
              local_138[uVar15] = bVar2;
              uVar15 = uVar15 + 1;
            } while (uVar14 != uVar15);
          }
          uVar8 = bVar1 - 0x10;
          bVar24 = (bVar1 & 0x10) == 0;
          uVar12 = uVar8;
          if (bVar24) {
            uVar12 = (uint)bVar1;
          }
          ppJVar13 = local_170 + bVar1;
          if (!bVar24) {
            ppJVar13 = local_168 + uVar8;
          }
          if (3 < (int)uVar12) {
            pjVar11 = cinfo->err;
            pjVar11->msg_code = 0x1f;
            (pjVar11->msg_parm).i[0] = uVar12;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          if (*ppJVar13 == (JHUFF_TBL *)0x0) {
            pJVar9 = jpeg_alloc_huff_table((j_common_ptr)cinfo);
            *ppJVar13 = pJVar9;
          }
          lVar19 = (lVar19 + -0x11) - uVar14;
          pJVar9 = *ppJVar13;
          pJVar9->bits[0x10] = local_198[0x10];
          *(ulong *)pJVar9->bits =
               CONCAT17(local_198[7],
                        CONCAT16(local_198[6],
                                 CONCAT15(local_198[5],
                                          CONCAT14(local_198[4],
                                                   CONCAT13(local_198[3],
                                                            CONCAT12(local_198[2],
                                                                     CONCAT11(local_198[1],
                                                                              local_198[0])))))));
          *(ulong *)(pJVar9->bits + 8) =
               CONCAT17(local_198[0xf],
                        CONCAT16(local_198[0xe],
                                 CONCAT15(local_198[0xd],
                                          CONCAT14(local_198[0xc],
                                                   CONCAT13(local_198[0xb],
                                                            CONCAT12(local_198[10],
                                                                     CONCAT11(local_198[9],
                                                                              local_198[8])))))));
          memcpy((*ppJVar13)->huffval,local_138,0x100);
        } while (0x10 < lVar19);
      }
      if (lVar19 != 0) {
        pjVar11 = cinfo->err;
        pjVar11->msg_code = 0xc;
        (*pjVar11->error_exit)((j_common_ptr)cinfo);
      }
      pjVar5->next_input_byte = pbVar20;
      pjVar5->bytes_in_buffer = sVar22;
      break;
    case 0xc9:
      bVar6 = 0;
      goto LAB_00105c15;
    case 0xca:
      bVar6 = 1;
LAB_00105c15:
      is_baseline = 0;
      is_arith = 1;
      goto LAB_00105c1a;
    case 0xcc:
      pjVar5 = cinfo->src;
      sVar22 = pjVar5->bytes_in_buffer;
      if (sVar22 == 0) {
        bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
        if (bVar6 == 0) goto LAB_001067e7;
        sVar22 = pjVar5->bytes_in_buffer;
      }
      bVar1 = *pjVar5->next_input_byte;
      sVar22 = sVar22 - 1;
      if (sVar22 == 0) {
        bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
        if (bVar6 == 0) goto LAB_001067e7;
        pbVar17 = pjVar5->next_input_byte;
        sVar22 = pjVar5->bytes_in_buffer;
      }
      else {
        pbVar17 = pjVar5->next_input_byte + 1;
      }
      uVar15 = (ulong)bVar1 * 0x100;
      uVar14 = uVar15 | *pbVar17;
      pbVar20 = pbVar17 + 1;
      sVar22 = sVar22 - 1;
      if (uVar14 < 3) {
        lVar19 = uVar15 + *pbVar17 + -2;
      }
      else {
        do {
          uVar15 = uVar14;
          if (sVar22 == 0) {
            bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
            if (bVar6 == 0) goto LAB_001067e7;
            pbVar20 = pjVar5->next_input_byte;
            sVar22 = pjVar5->bytes_in_buffer;
          }
          bVar1 = *pbVar20;
          sVar22 = sVar22 - 1;
          if (sVar22 == 0) {
            bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
            if (bVar6 == 0) goto LAB_001067e7;
            pbVar20 = pjVar5->next_input_byte;
            sVar22 = pjVar5->bytes_in_buffer;
          }
          else {
            pbVar20 = pbVar20 + 1;
          }
          bVar2 = *pbVar20;
          pjVar11 = cinfo->err;
          pjVar11->msg_code = 0x51;
          (pjVar11->msg_parm).i[0] = (uint)bVar1;
          (cinfo->err->msg_parm).i[1] = (uint)bVar2;
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
          if (0x1f < bVar1) {
            pjVar11 = cinfo->err;
            pjVar11->msg_code = 0x1d;
            (pjVar11->msg_parm).i[0] = (uint)bVar1;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          uVar12 = (uint)bVar1;
          if (bVar1 < 0x10) {
            cinfo->arith_dc_L[uVar12] = bVar2 & 0xf;
            cinfo->arith_dc_U[uVar12] = bVar2 >> 4;
            if (bVar2 >> 4 < (bVar2 & 0xf)) {
              pjVar11 = cinfo->err;
              pjVar11->msg_code = 0x1e;
              (pjVar11->msg_parm).i[0] = (uint)bVar2;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            }
          }
          else {
            cinfo->arith_ac_K[uVar12 - 0x10] = bVar2;
          }
          pbVar20 = pbVar20 + 1;
          sVar22 = sVar22 - 1;
          uVar14 = uVar15 - 2;
        } while (2 < (long)uVar14);
        lVar19 = uVar15 - 4;
      }
      if (lVar19 != 0) {
        pjVar11 = cinfo->err;
        pjVar11->msg_code = 0xc;
        (*pjVar11->error_exit)((j_common_ptr)cinfo);
      }
      pjVar5->next_input_byte = pbVar20;
      pjVar5->bytes_in_buffer = sVar22;
      break;
    case 0xd0:
    case 0xd1:
    case 0xd2:
    case 0xd3:
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
      goto switchD_00105a04_caseD_d0;
    case 0xd8:
      pjVar11 = cinfo->err;
      pjVar11->msg_code = 0x68;
      (*pjVar11->emit_message)((j_common_ptr)cinfo,1);
      if (cinfo->marker->saw_SOI != 0) {
        pjVar11 = cinfo->err;
        pjVar11->msg_code = 0x3f;
        (*pjVar11->error_exit)((j_common_ptr)cinfo);
      }
      local_140[0] = '\0';
      local_140[1] = '\0';
      local_140[2] = '\0';
      local_140[3] = '\0';
      local_140[4] = '\0';
      local_140[5] = '\0';
      local_140[6] = '\0';
      local_140[7] = '\0';
      local_140[8] = '\0';
      local_140[9] = '\0';
      local_140[10] = '\0';
      local_140[0xb] = '\0';
      local_140[0xc] = '\0';
      local_140[0xd] = '\0';
      local_140[0xe] = '\0';
      local_140[0xf] = '\0';
      builtin_memcpy(local_148,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                     0x10);
      builtin_memcpy(local_150,"\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05",
                     0x10);
      cinfo->restart_interval = 0;
      cinfo->saw_JFIF_marker = 0;
      cinfo->jpeg_color_space = JCS_UNKNOWN;
      cinfo->CCIR601_sampling = 0;
      cinfo->JFIF_major_version = '\x01';
      cinfo->JFIF_minor_version = '\x01';
      cinfo->density_unit = '\0';
      cinfo->X_density = 1;
      cinfo->Y_density = 1;
      cinfo->saw_Adobe_marker = 0;
      cinfo->Adobe_transform = '\0';
      cinfo->marker->saw_SOI = 1;
      break;
    case 0xd9:
      pjVar11 = cinfo->err;
      pjVar11->msg_code = 0x57;
      (*pjVar11->emit_message)((j_common_ptr)cinfo,1);
      cinfo->unread_marker = 0;
      return 2;
    case 0xda:
      pjVar5 = cinfo->src;
      pJVar18 = pjVar5->next_input_byte;
      sVar22 = pjVar5->bytes_in_buffer;
      if (cinfo->marker->saw_SOF == 0) {
        pjVar11 = cinfo->err;
        pjVar11->msg_code = 0x40;
        (*pjVar11->error_exit)((j_common_ptr)cinfo);
      }
      if (sVar22 == 0) {
        bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
        if (bVar6 == 0) goto LAB_001067e7;
        pJVar18 = pjVar5->next_input_byte;
        sVar22 = pjVar5->bytes_in_buffer;
      }
      JVar3 = *pJVar18;
      sVar22 = sVar22 - 1;
      if (sVar22 == 0) {
        bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
        if (bVar6 == 0) goto LAB_001067e7;
        pJVar18 = pjVar5->next_input_byte;
        sVar22 = pjVar5->bytes_in_buffer;
      }
      else {
        pJVar18 = pJVar18 + 1;
      }
      JVar4 = *pJVar18;
      sVar22 = sVar22 - 1;
      if (sVar22 == 0) {
        bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
        if (bVar6 == 0) goto LAB_001067e7;
        pbVar17 = pjVar5->next_input_byte;
        sVar22 = pjVar5->bytes_in_buffer;
      }
      else {
        pbVar17 = pJVar18 + 1;
      }
      bVar1 = *pbVar17;
      uVar14 = (ulong)bVar1;
      pjVar11 = cinfo->err;
      pjVar11->msg_code = 0x69;
      *(uint *)&pjVar11->msg_parm = (uint)bVar1;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      local_180 = uVar14;
      if (((CONCAT11(JVar3,JVar4) != (ushort)((ushort)bVar1 * 2 + 6)) || (4 < bVar1)) ||
         ((bVar1 == 0 && (cinfo->progressive_mode == 0)))) {
        pjVar11 = cinfo->err;
        pjVar11->msg_code = 0xc;
        (*pjVar11->error_exit)((j_common_ptr)cinfo);
      }
      cinfo->comps_in_scan = (int)local_180;
      pbVar17 = pbVar17 + 1;
      sVar22 = sVar22 - 1;
      if ((int)local_180 == 0) goto LAB_001066e1;
      uVar14 = local_180 & 0xffffffff;
      uVar15 = 0;
      goto LAB_00106604;
    case 0xdb:
      pjVar5 = cinfo->src;
      sVar22 = pjVar5->bytes_in_buffer;
      if (sVar22 == 0) {
        bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
        if (bVar6 == 0) goto LAB_001067e7;
        sVar22 = pjVar5->bytes_in_buffer;
      }
      bVar1 = *pjVar5->next_input_byte;
      sVar22 = sVar22 - 1;
      local_178 = pjVar5;
      if (sVar22 == 0) {
        bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
        if (bVar6 == 0) goto LAB_001067e7;
        pbVar17 = pjVar5->next_input_byte;
        sVar22 = pjVar5->bytes_in_buffer;
      }
      else {
        pbVar17 = pjVar5->next_input_byte + 1;
      }
      uVar14 = (ulong)bVar1 * 0x100;
      sVar22 = sVar22 - 1;
      pbVar20 = pbVar17 + 1;
      lVar19 = uVar14 + *pbVar17 + -2;
      if (2 < (uVar14 | *pbVar17)) {
        do {
          pjVar5 = local_178;
          if (sVar22 == 0) {
            bVar6 = (*local_178->fill_input_buffer)(cinfo);
            if (bVar6 == 0) goto LAB_001067e7;
            pbVar20 = pjVar5->next_input_byte;
            sVar22 = pjVar5->bytes_in_buffer;
          }
          bVar1 = *pbVar20;
          uVar12 = bVar1 & 0xf;
          pjVar11 = cinfo->err;
          pjVar11->msg_code = 0x53;
          (pjVar11->msg_parm).i[0] = uVar12;
          *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)(bVar1 >> 4);
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
          if (3 < uVar12) {
            pjVar11 = cinfo->err;
            pjVar11->msg_code = 0x20;
            (pjVar11->msg_parm).i[0] = uVar12;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          if (cinfo->quant_tbl_ptrs[uVar12] == (JQUANT_TBL *)0x0) {
            pJVar10 = jpeg_alloc_quant_table((j_common_ptr)cinfo);
            cinfo->quant_tbl_ptrs[uVar12] = pJVar10;
          }
          local_158 = lVar19 - 1;
          pJVar10 = cinfo->quant_tbl_ptrs[uVar12];
          if (bVar1 < 0x10) {
            if (lVar19 < 0x41) {
              lVar19 = 0;
              do {
                pJVar10->quantval[lVar19] = 1;
                lVar19 = lVar19 + 1;
              } while (lVar19 != 0x40);
              local_160 = 0;
              uVar14 = local_158;
            }
            else {
              local_160 = 0;
              uVar14 = 0x40;
            }
          }
          else {
            local_160 = 0x40;
            uVar14 = 0x40;
            if (lVar19 < 0x81) {
              lVar19 = 0;
              do {
                pJVar10->quantval[lVar19] = 1;
                lVar19 = lVar19 + 1;
              } while (lVar19 != 0x40);
              local_160 = local_158 >> 1;
              uVar14 = local_160;
            }
          }
          if ((long)uVar14 < 0x19) {
            local_1a8 = jpeg_natural_order2;
            if (uVar14 != 4) {
              if (uVar14 == 9) {
                local_1a8 = jpeg_natural_order3;
              }
              else if (uVar14 == 0x10) {
                local_1a8 = jpeg_natural_order4;
              }
              else {
LAB_001060fe:
                local_1a8 = jpeg_natural_order;
              }
            }
          }
          else if (uVar14 == 0x19) {
            local_1a8 = jpeg_natural_order5;
          }
          else if (uVar14 == 0x24) {
            local_1a8 = jpeg_natural_order6;
          }
          else {
            if (uVar14 != 0x31) goto LAB_001060fe;
            local_1a8 = jpeg_natural_order7;
          }
          sVar22 = sVar22 - 1;
          pbVar20 = pbVar20 + 1;
          local_180 = uVar14;
          if (0 < (long)uVar14) {
            uVar15 = 0;
            do {
              pjVar5 = local_178;
              if (bVar1 < 0x10) {
                if (sVar22 == 0) {
                  bVar6 = (*local_178->fill_input_buffer)(cinfo);
                  if (bVar6 == 0) goto LAB_001067e7;
                  pbVar20 = pjVar5->next_input_byte;
                  sVar22 = pjVar5->bytes_in_buffer;
                  uVar14 = local_180;
                }
                UVar16 = (UINT16)*pbVar20;
              }
              else {
                if (sVar22 == 0) {
                  bVar6 = (*local_178->fill_input_buffer)(cinfo);
                  if (bVar6 == 0) goto LAB_001067e7;
                  pbVar20 = pjVar5->next_input_byte;
                  sVar22 = pjVar5->bytes_in_buffer;
                  uVar14 = local_180;
                }
                pjVar5 = local_178;
                bVar2 = *pbVar20;
                sVar22 = sVar22 - 1;
                if (sVar22 == 0) {
                  bVar6 = (*local_178->fill_input_buffer)(cinfo);
                  if (bVar6 == 0) goto LAB_001067e7;
                  pbVar20 = pjVar5->next_input_byte;
                  sVar22 = pjVar5->bytes_in_buffer;
                  uVar14 = local_180;
                }
                else {
                  pbVar20 = pbVar20 + 1;
                }
                UVar16 = CONCAT11(bVar2,*pbVar20);
              }
              pJVar10->quantval[local_1a8[uVar15]] = UVar16;
              uVar15 = uVar15 + 1;
              sVar22 = sVar22 - 1;
              pbVar20 = pbVar20 + 1;
            } while (uVar14 != uVar15);
          }
          if (1 < cinfo->err->trace_level) {
            uVar14 = 0xfffffffffffffff8;
            do {
              pjVar11 = cinfo->err;
              *(uint *)&pjVar11->msg_parm = (uint)pJVar10->quantval[uVar14 + 8];
              *(uint *)((long)&pjVar11->msg_parm + 4) = (uint)pJVar10->quantval[uVar14 + 9];
              *(uint *)((long)&pjVar11->msg_parm + 8) = (uint)pJVar10->quantval[uVar14 + 10];
              *(uint *)((long)&pjVar11->msg_parm + 0xc) = (uint)pJVar10->quantval[uVar14 + 0xb];
              *(uint *)((long)&pjVar11->msg_parm + 0x10) = (uint)pJVar10->quantval[uVar14 + 0xc];
              *(uint *)((long)&pjVar11->msg_parm + 0x14) = (uint)pJVar10->quantval[uVar14 + 0xd];
              *(uint *)((long)&pjVar11->msg_parm + 0x18) = (uint)pJVar10->quantval[uVar14 + 0xe];
              *(uint *)((long)&pjVar11->msg_parm + 0x1c) = (uint)pJVar10->quantval[uVar14 + 0xf];
              pjVar11->msg_code = 0x5f;
              (*pjVar11->emit_message)((j_common_ptr)cinfo,2);
              uVar14 = uVar14 + 8;
            } while (uVar14 < 0x38);
          }
          lVar19 = local_158 - (local_160 + local_180);
        } while (0 < lVar19);
      }
      if (lVar19 != 0) {
        pjVar11 = cinfo->err;
        pjVar11->msg_code = 0xc;
        (*pjVar11->error_exit)((j_common_ptr)cinfo);
      }
      local_178->next_input_byte = pbVar20;
      local_178->bytes_in_buffer = sVar22;
      break;
    case 0xdc:
      iVar7 = skip_variable(cinfo);
      goto LAB_00105a19;
    case 0xdd:
      pjVar5 = cinfo->src;
      sVar22 = pjVar5->bytes_in_buffer;
      if (sVar22 == 0) {
        bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
        if (bVar6 == 0) goto LAB_001067e7;
        sVar22 = pjVar5->bytes_in_buffer;
      }
      JVar3 = *pjVar5->next_input_byte;
      sVar22 = sVar22 - 1;
      if (sVar22 == 0) {
        bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
        if (bVar6 == 0) goto LAB_001067e7;
        pJVar18 = pjVar5->next_input_byte;
        sVar22 = pjVar5->bytes_in_buffer;
      }
      else {
        pJVar18 = pjVar5->next_input_byte + 1;
      }
      if (CONCAT11(JVar3,*pJVar18) != 4) {
        pjVar11 = cinfo->err;
        pjVar11->msg_code = 0xc;
        (*pjVar11->error_exit)((j_common_ptr)cinfo);
      }
      sVar22 = sVar22 - 1;
      if (sVar22 == 0) {
        bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
        if (bVar6 == 0) goto LAB_001067e7;
        pJVar18 = pjVar5->next_input_byte;
        sVar22 = pjVar5->bytes_in_buffer;
      }
      else {
        pJVar18 = pJVar18 + 1;
      }
      JVar3 = *pJVar18;
      sVar22 = sVar22 - 1;
      if (sVar22 == 0) {
        bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
        if (bVar6 == 0) goto LAB_001067e7;
        pJVar18 = pjVar5->next_input_byte;
        sVar22 = pjVar5->bytes_in_buffer;
      }
      else {
        pJVar18 = pJVar18 + 1;
      }
      JVar4 = *pJVar18;
      pjVar11 = cinfo->err;
      pjVar11->msg_code = 0x54;
      (pjVar11->msg_parm).i[0] = (uint)CONCAT11(JVar3,JVar4);
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      cinfo->restart_interval = (uint)CONCAT11(JVar3,JVar4);
      pjVar5->next_input_byte = pJVar18 + 1;
      pjVar5->bytes_in_buffer = sVar22 - 1;
      break;
    case 0xde:
    case 0xdf:
    case 0xf0:
    case 0xf1:
    case 0xf2:
    case 0xf3:
    case 0xf4:
    case 0xf5:
    case 0xf6:
    case 0xf7:
    case 0xf8:
    case 0xf9:
    case 0xfa:
    case 0xfb:
    case 0xfc:
    case 0xfd:
switchD_00105a04_caseD_de:
      pjVar11 = cinfo->err;
      pjVar11->msg_code = 0x46;
LAB_00105a30:
      (pjVar11->msg_parm).i[0] = iVar7;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      break;
    case 0xe0:
    case 0xe1:
    case 0xe2:
    case 0xe3:
    case 0xe4:
    case 0xe5:
    case 0xe6:
    case 0xe7:
    case 0xe8:
    case 0xe9:
    case 0xea:
    case 0xeb:
    case 0xec:
    case 0xed:
    case 0xee:
    case 0xef:
      iVar7 = (**(code **)((long)cinfo->marker + (long)iVar7 * 8 + -0x6d0))(cinfo);
      goto LAB_00105a19;
    case 0xfe:
      iVar7 = (*cinfo->marker[1].reset_marker_reader)(cinfo);
LAB_00105a19:
      if (iVar7 == 0) goto LAB_001067e7;
      break;
    default:
      if (iVar7 != 1) goto switchD_00105a04_caseD_de;
switchD_00105a04_caseD_d0:
      pjVar11 = cinfo->err;
      pjVar11->msg_code = 0x5e;
      (pjVar11->msg_parm).i[0] = iVar7;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    }
    cinfo->unread_marker = 0;
  } while( true );
LAB_00106604:
  do {
    if (sVar22 == 0) {
      bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
      if (bVar6 == 0) goto LAB_001067e7;
      pbVar17 = pjVar5->next_input_byte;
      sVar22 = pjVar5->bytes_in_buffer;
    }
    bVar1 = *pbVar17;
    sVar22 = sVar22 - 1;
    if (sVar22 == 0) {
      bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
      if (bVar6 == 0) goto LAB_001067e7;
      pbVar17 = pjVar5->next_input_byte;
      sVar22 = pjVar5->bytes_in_buffer;
    }
    else {
      pbVar17 = pbVar17 + 1;
    }
    bVar2 = *pbVar17;
    pjVar21 = cinfo->comp_info;
    iVar7 = cinfo->num_components;
    uVar12 = (uint)bVar1;
    if (0 < iVar7) {
      do {
        if (pjVar21->component_id == uVar12) goto LAB_00106681;
        pjVar21 = pjVar21 + 1;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    pjVar11 = cinfo->err;
    pjVar11->msg_code = 4;
    (pjVar11->msg_parm).i[0] = uVar12;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
LAB_00106681:
    cinfo->cur_comp_info[uVar15] = pjVar21;
    pjVar21->dc_tbl_no = (uint)(bVar2 >> 4);
    pjVar21->ac_tbl_no = bVar2 & 0xf;
    pjVar11 = cinfo->err;
    (pjVar11->msg_parm).i[0] = uVar12;
    (pjVar11->msg_parm).i[1] = pjVar21->dc_tbl_no;
    (pjVar11->msg_parm).i[2] = pjVar21->ac_tbl_no;
    pjVar11->msg_code = 0x6a;
    (*pjVar11->emit_message)((j_common_ptr)cinfo,1);
    uVar15 = uVar15 + 1;
    pbVar17 = pbVar17 + 1;
    sVar22 = sVar22 - 1;
  } while (uVar15 != uVar14);
LAB_001066e1:
  uVar14 = local_180;
  if (sVar22 == 0) {
    bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
    if (bVar6 != 0) {
      pbVar17 = pjVar5->next_input_byte;
      sVar22 = pjVar5->bytes_in_buffer;
      goto LAB_00106703;
    }
LAB_001067e7:
    iVar7 = 0;
  }
  else {
LAB_00106703:
    cinfo->Ss = (uint)*pbVar17;
    sVar22 = sVar22 - 1;
    if (sVar22 == 0) {
      bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
      if (bVar6 == 0) goto LAB_001067e7;
      pbVar17 = pjVar5->next_input_byte;
      sVar22 = pjVar5->bytes_in_buffer;
    }
    else {
      pbVar17 = pbVar17 + 1;
    }
    cinfo->Se = (uint)*pbVar17;
    sVar22 = sVar22 - 1;
    if (sVar22 == 0) {
      bVar6 = (*pjVar5->fill_input_buffer)(cinfo);
      if (bVar6 == 0) goto LAB_001067e7;
      pbVar17 = pjVar5->next_input_byte;
      sVar22 = pjVar5->bytes_in_buffer;
    }
    else {
      pbVar17 = pbVar17 + 1;
    }
    bVar1 = *pbVar17;
    cinfo->Ah = (uint)(bVar1 >> 4);
    cinfo->Al = bVar1 & 0xf;
    pjVar11 = cinfo->err;
    (pjVar11->msg_parm).i[0] = cinfo->Ss;
    (pjVar11->msg_parm).i[1] = cinfo->Se;
    (pjVar11->msg_parm).i[2] = cinfo->Ah;
    (pjVar11->msg_parm).i[3] = cinfo->Al;
    pjVar11->msg_code = 0x6b;
    iVar7 = 1;
    (*pjVar11->emit_message)((j_common_ptr)cinfo,1);
    cinfo->marker->next_restart_num = 0;
    if ((int)uVar14 != 0) {
      cinfo->input_scan_number = cinfo->input_scan_number + 1;
    }
    pjVar5->next_input_byte = pbVar17 + 1;
    pjVar5->bytes_in_buffer = sVar22 - 1;
    cinfo->unread_marker = 0;
  }
  return iVar7;
}

Assistant:

METHODDEF(int)
read_markers (j_decompress_ptr cinfo)
{
  /* Outer loop repeats once for each marker. */
  for (;;) {
    /* Collect the marker proper, unless we already did. */
    /* NB: first_marker() enforces the requirement that SOI appear first. */
    if (cinfo->unread_marker == 0) {
      if (! cinfo->marker->saw_SOI) {
	if (! first_marker(cinfo))
	  return JPEG_SUSPENDED;
      } else {
	if (! next_marker(cinfo))
	  return JPEG_SUSPENDED;
      }
    }
    /* At this point cinfo->unread_marker contains the marker code and the
     * input point is just past the marker proper, but before any parameters.
     * A suspension will cause us to return with this state still true.
     */
    switch (cinfo->unread_marker) {
    case M_SOI:
      if (! get_soi(cinfo))
	return JPEG_SUSPENDED;
      break;

    case M_SOF0:		/* Baseline */
      if (! get_sof(cinfo, TRUE, FALSE, FALSE))
	return JPEG_SUSPENDED;
      break;

    case M_SOF1:		/* Extended sequential, Huffman */
      if (! get_sof(cinfo, FALSE, FALSE, FALSE))
	return JPEG_SUSPENDED;
      break;

    case M_SOF2:		/* Progressive, Huffman */
      if (! get_sof(cinfo, FALSE, TRUE, FALSE))
	return JPEG_SUSPENDED;
      break;

    case M_SOF9:		/* Extended sequential, arithmetic */
      if (! get_sof(cinfo, FALSE, FALSE, TRUE))
	return JPEG_SUSPENDED;
      break;

    case M_SOF10:		/* Progressive, arithmetic */
      if (! get_sof(cinfo, FALSE, TRUE, TRUE))
	return JPEG_SUSPENDED;
      break;

    /* Currently unsupported SOFn types */
    case M_SOF3:		/* Lossless, Huffman */
    case M_SOF5:		/* Differential sequential, Huffman */
    case M_SOF6:		/* Differential progressive, Huffman */
    case M_SOF7:		/* Differential lossless, Huffman */
    case M_JPG:			/* Reserved for JPEG extensions */
    case M_SOF11:		/* Lossless, arithmetic */
    case M_SOF13:		/* Differential sequential, arithmetic */
    case M_SOF14:		/* Differential progressive, arithmetic */
    case M_SOF15:		/* Differential lossless, arithmetic */
      ERREXIT1(cinfo, JERR_SOF_UNSUPPORTED, cinfo->unread_marker);
      break;

    case M_SOS:
      if (! get_sos(cinfo))
	return JPEG_SUSPENDED;
      cinfo->unread_marker = 0;	/* processed the marker */
      return JPEG_REACHED_SOS;
    
    case M_EOI:
      TRACEMS(cinfo, 1, JTRC_EOI);
      cinfo->unread_marker = 0;	/* processed the marker */
      return JPEG_REACHED_EOI;
      
    case M_DAC:
      if (! get_dac(cinfo))
	return JPEG_SUSPENDED;
      break;
      
    case M_DHT:
      if (! get_dht(cinfo))
	return JPEG_SUSPENDED;
      break;
      
    case M_DQT:
      if (! get_dqt(cinfo))
	return JPEG_SUSPENDED;
      break;
      
    case M_DRI:
      if (! get_dri(cinfo))
	return JPEG_SUSPENDED;
      break;
      
    case M_APP0:
    case M_APP1:
    case M_APP2:
    case M_APP3:
    case M_APP4:
    case M_APP5:
    case M_APP6:
    case M_APP7:
    case M_APP8:
    case M_APP9:
    case M_APP10:
    case M_APP11:
    case M_APP12:
    case M_APP13:
    case M_APP14:
    case M_APP15:
      if (! (*((my_marker_ptr) cinfo->marker)->process_APPn[
		cinfo->unread_marker - (int) M_APP0]) (cinfo))
	return JPEG_SUSPENDED;
      break;
      
    case M_COM:
      if (! (*((my_marker_ptr) cinfo->marker)->process_COM) (cinfo))
	return JPEG_SUSPENDED;
      break;

    case M_RST0:		/* these are all parameterless */
    case M_RST1:
    case M_RST2:
    case M_RST3:
    case M_RST4:
    case M_RST5:
    case M_RST6:
    case M_RST7:
    case M_TEM:
      TRACEMS1(cinfo, 1, JTRC_PARMLESS_MARKER, cinfo->unread_marker);
      break;

    case M_DNL:			/* Ignore DNL ... perhaps the wrong thing */
      if (! skip_variable(cinfo))
	return JPEG_SUSPENDED;
      break;

    default:			/* must be DHP, EXP, JPGn, or RESn */
      /* For now, we treat the reserved markers as fatal errors since they are
       * likely to be used to signal incompatible JPEG Part 3 extensions.
       * Once the JPEG 3 version-number marker is well defined, this code
       * ought to change!
       */
      ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, cinfo->unread_marker);
      break;
    }
    /* Successfully processed marker, so reset state variable */
    cinfo->unread_marker = 0;
  } /* end loop */
}